

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int begin_set_properties(BEGIN_HANDLE begin,fields properties_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  BEGIN_INSTANCE *begin_instance;
  
  if (begin == (BEGIN_HANDLE)0x0) {
    iVar2 = 0xd4b;
  }
  else {
    item_value = amqpvalue_clone(properties_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0xd53;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(begin->composite_value,7,item_value);
      iVar2 = 0xd59;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int begin_set_properties(BEGIN_HANDLE begin, fields properties_value)
{
    int result;

    if (begin == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        BEGIN_INSTANCE* begin_instance = (BEGIN_INSTANCE*)begin;
        AMQP_VALUE properties_amqp_value = amqpvalue_create_fields(properties_value);
        if (properties_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(begin_instance->composite_value, 7, properties_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(properties_amqp_value);
        }
    }

    return result;
}